

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::RepeatedWellKnownTypes::_InternalSerialize
          (RepeatedWellKnownTypes *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  RepeatedPtrField<google::protobuf::Any> *this_00;
  const_reference this_01;
  RepeatedPtrField<google::protobuf::Api> *this_02;
  const_reference this_03;
  RepeatedPtrField<google::protobuf::Duration> *this_04;
  const_reference this_05;
  RepeatedPtrField<google::protobuf::Empty> *this_06;
  ZeroFieldsBase *this_07;
  RepeatedPtrField<google::protobuf::FieldMask> *this_08;
  const_reference this_09;
  RepeatedPtrField<google::protobuf::SourceContext> *this_10;
  const_reference this_11;
  RepeatedPtrField<google::protobuf::Struct> *this_12;
  const_reference this_13;
  RepeatedPtrField<google::protobuf::Timestamp> *this_14;
  const_reference this_15;
  RepeatedPtrField<google::protobuf::Type> *this_16;
  const_reference this_17;
  RepeatedPtrField<google::protobuf::DoubleValue> *this_18;
  const_reference this_19;
  RepeatedPtrField<google::protobuf::FloatValue> *this_20;
  const_reference this_21;
  RepeatedPtrField<google::protobuf::Int64Value> *this_22;
  const_reference this_23;
  RepeatedPtrField<google::protobuf::UInt64Value> *this_24;
  const_reference this_25;
  RepeatedPtrField<google::protobuf::Int32Value> *this_26;
  const_reference this_27;
  RepeatedPtrField<google::protobuf::UInt32Value> *this_28;
  const_reference this_29;
  RepeatedPtrField<google::protobuf::BoolValue> *this_30;
  const_reference this_31;
  RepeatedPtrField<google::protobuf::StringValue> *this_32;
  const_reference this_33;
  RepeatedPtrField<google::protobuf::BytesValue> *this_34;
  const_reference this_35;
  UnknownFieldSet *unknown_fields;
  BytesValue *repfield_17;
  uint n_17;
  uint i_17;
  StringValue *repfield_16;
  uint n_16;
  uint i_16;
  BoolValue *repfield_15;
  uint n_15;
  uint i_15;
  UInt32Value *repfield_14;
  uint n_14;
  uint i_14;
  Int32Value *repfield_13;
  uint n_13;
  uint i_13;
  UInt64Value *repfield_12;
  uint n_12;
  uint i_12;
  Int64Value *repfield_11;
  uint n_11;
  uint i_11;
  FloatValue *repfield_10;
  uint n_10;
  uint i_10;
  DoubleValue *repfield_9;
  uint n_9;
  uint i_9;
  Type *repfield_8;
  uint n_8;
  uint i_8;
  Timestamp *repfield_7;
  uint n_7;
  uint i_7;
  Struct *repfield_6;
  uint n_6;
  uint i_6;
  SourceContext *repfield_5;
  uint n_5;
  uint i_5;
  FieldMask *repfield_4;
  uint n_4;
  uint i_4;
  Empty *repfield_3;
  uint n_3;
  uint i_3;
  Duration *repfield_2;
  uint n_2;
  uint i_2;
  Api *repfield_1;
  uint n_1;
  uint i_1;
  Any *repfield;
  uint local_30;
  uint n;
  uint i;
  uint32_t cached_has_bits;
  RepeatedWellKnownTypes *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  RepeatedWellKnownTypes *this_local;
  
  local_30 = 0;
  uVar2 = _internal_any_field_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  for (; local_30 < uVar2; local_30 = local_30 + 1) {
    this_00 = _internal_any_field(this);
    this_01 = google::protobuf::RepeatedPtrField<google::protobuf::Any>::Get(this_00,local_30);
    iVar3 = google::protobuf::Any::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (1,(MessageLite *)this_01,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_1._4_4_ = 0;
  uVar2 = _internal_api_field_size(this);
  for (; repfield_1._4_4_ < uVar2; repfield_1._4_4_ = repfield_1._4_4_ + 1) {
    this_02 = _internal_api_field(this);
    this_03 = google::protobuf::RepeatedPtrField<google::protobuf::Api>::Get
                        (this_02,repfield_1._4_4_);
    iVar3 = google::protobuf::Api::GetCachedSize(this_03);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (2,(MessageLite *)this_03,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_2._4_4_ = 0;
  uVar2 = _internal_duration_field_size(this);
  for (; repfield_2._4_4_ < uVar2; repfield_2._4_4_ = repfield_2._4_4_ + 1) {
    this_04 = _internal_duration_field(this);
    this_05 = google::protobuf::RepeatedPtrField<google::protobuf::Duration>::Get
                        (this_04,repfield_2._4_4_);
    iVar3 = google::protobuf::Duration::GetCachedSize(this_05);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (3,(MessageLite *)this_05,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_3._4_4_ = 0;
  uVar2 = _internal_empty_field_size(this);
  for (; repfield_3._4_4_ < uVar2; repfield_3._4_4_ = repfield_3._4_4_ + 1) {
    this_06 = _internal_empty_field(this);
    this_07 = &google::protobuf::RepeatedPtrField<google::protobuf::Empty>::Get
                         (this_06,repfield_3._4_4_)->super_ZeroFieldsBase;
    iVar3 = google::protobuf::internal::ZeroFieldsBase::GetCachedSize(this_07);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (4,(MessageLite *)this_07,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_4._4_4_ = 0;
  uVar2 = _internal_field_mask_field_size(this);
  for (; repfield_4._4_4_ < uVar2; repfield_4._4_4_ = repfield_4._4_4_ + 1) {
    this_08 = _internal_field_mask_field(this);
    this_09 = google::protobuf::RepeatedPtrField<google::protobuf::FieldMask>::Get
                        (this_08,repfield_4._4_4_);
    iVar3 = google::protobuf::FieldMask::GetCachedSize(this_09);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (5,(MessageLite *)this_09,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_5._4_4_ = 0;
  uVar2 = _internal_source_context_field_size(this);
  for (; repfield_5._4_4_ < uVar2; repfield_5._4_4_ = repfield_5._4_4_ + 1) {
    this_10 = _internal_source_context_field(this);
    this_11 = google::protobuf::RepeatedPtrField<google::protobuf::SourceContext>::Get
                        (this_10,repfield_5._4_4_);
    iVar3 = google::protobuf::SourceContext::GetCachedSize(this_11);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (6,(MessageLite *)this_11,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_6._4_4_ = 0;
  uVar2 = _internal_struct_field_size(this);
  for (; repfield_6._4_4_ < uVar2; repfield_6._4_4_ = repfield_6._4_4_ + 1) {
    this_12 = _internal_struct_field(this);
    this_13 = google::protobuf::RepeatedPtrField<google::protobuf::Struct>::Get
                        (this_12,repfield_6._4_4_);
    iVar3 = google::protobuf::Struct::GetCachedSize(this_13);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (7,(MessageLite *)this_13,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_7._4_4_ = 0;
  uVar2 = _internal_timestamp_field_size(this);
  for (; repfield_7._4_4_ < uVar2; repfield_7._4_4_ = repfield_7._4_4_ + 1) {
    this_14 = _internal_timestamp_field(this);
    this_15 = google::protobuf::RepeatedPtrField<google::protobuf::Timestamp>::Get
                        (this_14,repfield_7._4_4_);
    iVar3 = google::protobuf::Timestamp::GetCachedSize(this_15);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (8,(MessageLite *)this_15,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_8._4_4_ = 0;
  uVar2 = _internal_type_field_size(this);
  for (; repfield_8._4_4_ < uVar2; repfield_8._4_4_ = repfield_8._4_4_ + 1) {
    this_16 = _internal_type_field(this);
    this_17 = google::protobuf::RepeatedPtrField<google::protobuf::Type>::Get
                        (this_16,repfield_8._4_4_);
    iVar3 = google::protobuf::Type::GetCachedSize(this_17);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (9,(MessageLite *)this_17,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_9._4_4_ = 0;
  uVar2 = _internal_double_field_size(this);
  for (; repfield_9._4_4_ < uVar2; repfield_9._4_4_ = repfield_9._4_4_ + 1) {
    this_18 = _internal_double_field(this);
    this_19 = google::protobuf::RepeatedPtrField<google::protobuf::DoubleValue>::Get
                        (this_18,repfield_9._4_4_);
    iVar3 = google::protobuf::DoubleValue::GetCachedSize(this_19);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (10,(MessageLite *)this_19,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_10._4_4_ = 0;
  uVar2 = _internal_float_field_size(this);
  for (; repfield_10._4_4_ < uVar2; repfield_10._4_4_ = repfield_10._4_4_ + 1) {
    this_20 = _internal_float_field(this);
    this_21 = google::protobuf::RepeatedPtrField<google::protobuf::FloatValue>::Get
                        (this_20,repfield_10._4_4_);
    iVar3 = google::protobuf::FloatValue::GetCachedSize(this_21);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0xb,(MessageLite *)this_21,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_11._4_4_ = 0;
  uVar2 = _internal_int64_field_size(this);
  for (; repfield_11._4_4_ < uVar2; repfield_11._4_4_ = repfield_11._4_4_ + 1) {
    this_22 = _internal_int64_field(this);
    this_23 = google::protobuf::RepeatedPtrField<google::protobuf::Int64Value>::Get
                        (this_22,repfield_11._4_4_);
    iVar3 = google::protobuf::Int64Value::GetCachedSize(this_23);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0xc,(MessageLite *)this_23,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_12._4_4_ = 0;
  uVar2 = _internal_uint64_field_size(this);
  for (; repfield_12._4_4_ < uVar2; repfield_12._4_4_ = repfield_12._4_4_ + 1) {
    this_24 = _internal_uint64_field(this);
    this_25 = google::protobuf::RepeatedPtrField<google::protobuf::UInt64Value>::Get
                        (this_24,repfield_12._4_4_);
    iVar3 = google::protobuf::UInt64Value::GetCachedSize(this_25);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0xd,(MessageLite *)this_25,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_13._4_4_ = 0;
  uVar2 = _internal_int32_field_size(this);
  for (; repfield_13._4_4_ < uVar2; repfield_13._4_4_ = repfield_13._4_4_ + 1) {
    this_26 = _internal_int32_field(this);
    this_27 = google::protobuf::RepeatedPtrField<google::protobuf::Int32Value>::Get
                        (this_26,repfield_13._4_4_);
    iVar3 = google::protobuf::Int32Value::GetCachedSize(this_27);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0xe,(MessageLite *)this_27,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_14._4_4_ = 0;
  uVar2 = _internal_uint32_field_size(this);
  for (; repfield_14._4_4_ < uVar2; repfield_14._4_4_ = repfield_14._4_4_ + 1) {
    this_28 = _internal_uint32_field(this);
    this_29 = google::protobuf::RepeatedPtrField<google::protobuf::UInt32Value>::Get
                        (this_28,repfield_14._4_4_);
    iVar3 = google::protobuf::UInt32Value::GetCachedSize(this_29);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0xf,(MessageLite *)this_29,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_15._4_4_ = 0;
  uVar2 = _internal_bool_field_size(this);
  for (; repfield_15._4_4_ < uVar2; repfield_15._4_4_ = repfield_15._4_4_ + 1) {
    this_30 = _internal_bool_field(this);
    this_31 = google::protobuf::RepeatedPtrField<google::protobuf::BoolValue>::Get
                        (this_30,repfield_15._4_4_);
    iVar3 = google::protobuf::BoolValue::GetCachedSize(this_31);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0x10,(MessageLite *)this_31,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_16._4_4_ = 0;
  uVar2 = _internal_string_field_size(this);
  for (; repfield_16._4_4_ < uVar2; repfield_16._4_4_ = repfield_16._4_4_ + 1) {
    this_32 = _internal_string_field(this);
    this_33 = google::protobuf::RepeatedPtrField<google::protobuf::StringValue>::Get
                        (this_32,repfield_16._4_4_);
    iVar3 = google::protobuf::StringValue::GetCachedSize(this_33);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0x11,(MessageLite *)this_33,iVar3,(uint8_t *)stream_local,stream);
  }
  repfield_17._4_4_ = 0;
  uVar2 = _internal_bytes_field_size(this);
  for (; repfield_17._4_4_ < uVar2; repfield_17._4_4_ = repfield_17._4_4_ + 1) {
    this_34 = _internal_bytes_field(this);
    this_35 = google::protobuf::RepeatedPtrField<google::protobuf::BytesValue>::Get
                        (this_34,repfield_17._4_4_);
    iVar3 = google::protobuf::BytesValue::GetCachedSize(this_35);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (0x12,(MessageLite *)this_35,iVar3,(uint8_t *)stream_local,stream);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL RepeatedWellKnownTypes::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const RepeatedWellKnownTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.RepeatedWellKnownTypes)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated .google.protobuf.Any any_field = 1;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_any_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_any_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            1, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Api api_field = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_api_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_api_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Duration duration_field = 3;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_duration_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_duration_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            3, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Empty empty_field = 4;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_empty_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_empty_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            4, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.FieldMask field_mask_field = 5;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_field_mask_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_field_mask_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            5, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.SourceContext source_context_field = 6;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_source_context_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_source_context_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            6, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Struct struct_field = 7;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_struct_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_struct_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            7, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Timestamp timestamp_field = 8;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_timestamp_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_timestamp_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            8, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Type type_field = 9;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_type_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_type_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            9, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.DoubleValue double_field = 10;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_double_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_double_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            10, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.FloatValue float_field = 11;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_float_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_float_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            11, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Int64Value int64_field = 12;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_int64_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_int64_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            12, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.UInt64Value uint64_field = 13;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_uint64_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_uint64_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            13, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.Int32Value int32_field = 14;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_int32_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_int32_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            14, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.UInt32Value uint32_field = 15;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_uint32_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_uint32_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            15, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.BoolValue bool_field = 16;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_bool_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_bool_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            16, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.StringValue string_field = 17;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_string_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_string_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            17, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated .google.protobuf.BytesValue bytes_field = 18;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_bytes_field_size());
       i < n; i++) {
    const auto& repfield = this_._internal_bytes_field().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            18, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.RepeatedWellKnownTypes)
  return target;
}